

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void RGB24MirrorRow_C(uint8_t *src_rgb24,uint8_t *dst_rgb24,int width)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t *puVar3;
  bool bVar4;
  
  iVar2 = 0;
  if (0 < width) {
    iVar2 = width;
  }
  puVar3 = src_rgb24 + (long)(width * 3) + -1;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    uVar1 = *puVar3;
    *(undefined2 *)dst_rgb24 = *(undefined2 *)(puVar3 + -2);
    dst_rgb24[2] = uVar1;
    dst_rgb24 = dst_rgb24 + 3;
    puVar3 = puVar3 + -3;
  }
  return;
}

Assistant:

void RGB24MirrorRow_C(const uint8_t* src_rgb24, uint8_t* dst_rgb24, int width) {
  int x;
  src_rgb24 += width * 3 - 3;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb24[0];
    uint8_t g = src_rgb24[1];
    uint8_t r = src_rgb24[2];
    dst_rgb24[0] = b;
    dst_rgb24[1] = g;
    dst_rgb24[2] = r;
    src_rgb24 -= 3;
    dst_rgb24 += 3;
  }
}